

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_visitor.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>_>
::Visit<>(VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
          *this,Descriptor *descriptor)

{
  int iVar1;
  EnumDescriptor *descriptor_00;
  OneofDescriptor *descriptor_01;
  FieldDescriptor *pFVar2;
  Descriptor *descriptor_02;
  ExtensionRange *descriptor_03;
  int local_34;
  int local_30;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  Descriptor *descriptor_local;
  VisitImpl<google::protobuf::internal::VisitorImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_pybind[P]pybind11_protobuf_build_O0__deps_protobuf_src_src_google_protobuf_compiler_command_line_interface_cc:1276:16)>_>
  *this_local;
  
  _i = descriptor;
  descriptor_local = (Descriptor *)this;
  VisitorImpl<google::protobuf::compiler::CommandLineInterface::Run(int,char_const*const*)::$_0>::
  DescriptorEater::DescriptorEater<google::protobuf::Descriptor_const&>
            ((DescriptorEater *)((long)&i_1 + 3),descriptor);
  VisitorImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/command_line_interface.cc:1276:16)>
  ::operator()(&this->visitor);
  i_2 = 0;
  while( true ) {
    iVar1 = Descriptor::enum_type_count(_i);
    if (iVar1 <= i_2) break;
    descriptor_00 = Descriptor::enum_type(_i,i_2);
    Visit<>(this,descriptor_00);
    i_2 = i_2 + 1;
  }
  i_3 = 0;
  while( true ) {
    iVar1 = Descriptor::oneof_decl_count(_i);
    if (iVar1 <= i_3) break;
    descriptor_01 = Descriptor::oneof_decl(_i,i_3);
    Visit<>(this,descriptor_01);
    i_3 = i_3 + 1;
  }
  i_4 = 0;
  while( true ) {
    iVar1 = Descriptor::field_count(_i);
    if (iVar1 <= i_4) break;
    pFVar2 = Descriptor::field(_i,i_4);
    Visit<>(this,pFVar2);
    i_4 = i_4 + 1;
  }
  i_5 = 0;
  while( true ) {
    iVar1 = Descriptor::nested_type_count(_i);
    if (iVar1 <= i_5) break;
    descriptor_02 = Descriptor::nested_type(_i,i_5);
    Visit<>(this,descriptor_02);
    i_5 = i_5 + 1;
  }
  local_30 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_count(_i);
    if (iVar1 <= local_30) break;
    pFVar2 = Descriptor::extension(_i,local_30);
    Visit<>(this,pFVar2);
    local_30 = local_30 + 1;
  }
  local_34 = 0;
  while( true ) {
    iVar1 = Descriptor::extension_range_count(_i);
    if (iVar1 <= local_34) break;
    descriptor_03 = Descriptor::extension_range(_i,local_34);
    Visit<>(this,descriptor_03);
    local_34 = local_34 + 1;
  }
  return;
}

Assistant:

void Visit(const Descriptor& descriptor, Proto&... proto) {
    visitor(descriptor, proto...);

    for (int i = 0; i < descriptor.enum_type_count(); i++) {
      Visit(*descriptor.enum_type(i), enum_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.oneof_decl_count(); i++) {
      Visit(*descriptor.oneof_decl(i), oneof_decl(proto, i)...);
    }

    for (int i = 0; i < descriptor.field_count(); i++) {
      Visit(*descriptor.field(i), field(proto, i)...);
    }

    for (int i = 0; i < descriptor.nested_type_count(); i++) {
      Visit(*descriptor.nested_type(i), nested_type(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_count(); i++) {
      Visit(*descriptor.extension(i), extension(proto, i)...);
    }

    for (int i = 0; i < descriptor.extension_range_count(); i++) {
      Visit(*descriptor.extension_range(i), extension_range(proto, i)...);
    }
  }